

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *
wasm::WATParser::inlineExports
          (Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *__return_storage_ptr__,
          Lexer *in)

{
  pointer pNVar1;
  bool bVar2;
  string *this;
  string_view expected;
  undefined1 local_d0 [8];
  optional<wasm::Name> name;
  string local_98;
  Err local_78;
  undefined1 auStack_58 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> exports;
  allocator<char> local_31;
  
  exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)__return_storage_ptr__;
  do {
    expected._M_str = "export";
    expected._M_len = 6;
    bVar2 = Lexer::takeSExprStart(in,expected);
    if (!bVar2) {
      ((exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)->super_IString).str._M_len = (size_t)auStack_58;
      ((exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)->super_IString).str._M_str =
           (char *)exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start;
      exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[1].super_IString.str._M_len =
           (size_t)exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      auStack_58 = (undefined1  [8])0x0;
      exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 *)
       &exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[2].super_IString.str._M_len = 0;
LAB_00c0b356:
      pNVar1 = exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58);
      return (Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)pNVar1;
    }
    Lexer::takeName((optional<wasm::Name> *)local_d0,in);
    if (name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged,"expected export name",
                 &local_31);
      Lexer::err(&local_78,in,
                 (string *)
                 &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged);
      std::__detail::__variant::
      _Variant_storage<false,std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Err>
                  *)exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      this = (string *)
             &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._M_engaged;
LAB_00c0b34d:
      std::__cxx11::string::~string((string *)this);
      goto LAB_00c0b356;
    }
    bVar2 = Lexer::takeRParen(in);
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"expected end of import",&local_31);
      Lexer::err(&local_78,in,&local_98);
      std::__detail::__variant::
      _Variant_storage<false,std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Err>
                  *)exports.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      this = &local_98;
      goto LAB_00c0b34d;
    }
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58,(value_type *)local_d0)
    ;
  } while( true );
}

Assistant:

inline Result<std::vector<Name>> inlineExports(Lexer& in) {
  std::vector<Name> exports;
  while (in.takeSExprStart("export"sv)) {
    auto name = in.takeName();
    if (!name) {
      return in.err("expected export name");
    }
    if (!in.takeRParen()) {
      return in.err("expected end of import");
    }
    exports.push_back(*name);
  }
  return exports;
}